

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O1

Seg_Man_t * Seg_ManAlloc(Gia_Man_t *pGia,int nFanouts)

{
  byte bVar1;
  int iVar2;
  int **ppiVar3;
  uint uVar4;
  int iVar5;
  Seg_Man_t *p;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Int_t *vToSkip;
  sat_solver *psVar8;
  uint uVar9;
  
  p = (Seg_Man_t *)calloc(1,0x78);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  p->vPolars = pVVar6;
  vToSkip = (Vec_Int_t *)malloc(0x10);
  vToSkip->nCap = 1000;
  vToSkip->nSize = 0;
  piVar7 = (int *)malloc(4000);
  vToSkip->pArray = piVar7;
  p->vToSkip = vToSkip;
  pVVar6 = Seg_ManCountIntEdges(pGia,pVVar6,vToSkip,nFanouts);
  p->vEdges = pVVar6;
  uVar9 = pVVar6->nSize / 2;
  p->nVars = uVar9;
  if (1 < uVar9) {
    uVar9 = uVar9 - 1;
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else {
      uVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar9 = (uVar4 ^ 0xffffffe0) + 0x21;
    }
  }
  p->LogN = uVar9;
  p->Power2 = 1 << ((byte)uVar9 & 0x1f);
  psVar8 = sat_solver_new();
  p->pSat = psVar8;
  sat_solver_setnvars(psVar8,p->nVars);
  iVar5 = sat_solver_nvars(p->pSat);
  p->FirstVar = iVar5;
  psVar8 = p->pSat;
  if (psVar8->qhead == psVar8->qtail) {
    iVar5 = psVar8->size;
    psVar8->iVarPivot = iVar5;
    psVar8->iTrailPivot = psVar8->qhead;
    *(undefined8 *)(psVar8->Mem).BookMarkE = *(undefined8 *)(psVar8->Mem).nEntries;
    iVar2 = (psVar8->Mem).iPage[0];
    bVar1 = (byte)(psVar8->Mem).nPageSize;
    ppiVar3 = (psVar8->Mem).pPages;
    (psVar8->Mem).BookMarkH[0] = iVar2 << (bVar1 & 0x1f) | *ppiVar3[iVar2];
    iVar2 = (psVar8->Mem).iPage[1];
    (psVar8->Mem).BookMarkH[1] = iVar2 << (bVar1 & 0x1f) | *ppiVar3[iVar2];
    if (psVar8->activity2 != (word *)0x0) {
      psVar8->var_inc2 = psVar8->var_inc;
      memcpy(psVar8->activity2,psVar8->activity,(long)iVar5 << 3);
    }
    p->pGia = pGia;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 0;
    pVVar6->nSize = 0;
    pVVar6->pArray = (int *)0x0;
    p->vFirsts = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 0;
    pVVar6->nSize = 0;
    pVVar6->pArray = (int *)0x0;
    p->vNvars = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 0;
    pVVar6->nSize = 0;
    pVVar6->pArray = (int *)0x0;
    p->vLits = pVVar6;
    iVar5 = Seg_ManCountIntLevels(p,p->FirstVar);
    sat_solver_setnvars(p->pSat,iVar5);
    Gia_ManFillValue(pGia);
    return p;
  }
  __assert_fail("s->qhead == s->qtail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                ,0x137,"void sat_solver_bookmark(sat_solver *)");
}

Assistant:

Seg_Man_t * Seg_ManAlloc( Gia_Man_t * pGia, int nFanouts )
{
    int nVarsAll;
    Seg_Man_t * p = ABC_CALLOC( Seg_Man_t, 1 );
    p->vPolars    = Vec_IntAlloc( 1000 ); 
    p->vToSkip    = Vec_IntAlloc( 1000 ); 
    p->vEdges     = Seg_ManCountIntEdges( pGia, p->vPolars, p->vToSkip, nFanouts );
    p->nVars      = Vec_IntSize(p->vEdges)/2;
    p->LogN       = Abc_Base2Log(p->nVars);
    p->Power2     = 1 << p->LogN;
    //p->pSat       = Sbm_AddCardinSolver( p->LogN, &p->vCardVars );
    p->pSat       = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->nVars );
    p->FirstVar   = sat_solver_nvars( p->pSat );
    sat_solver_bookmark( p->pSat );
    p->pGia       = pGia;
    // internal
    p->vFirsts    = Vec_IntAlloc( 0 ); 
    p->vNvars     = Vec_IntAlloc( 0 ); 
    p->vLits      = Vec_IntAlloc( 0 ); 
    nVarsAll      = Seg_ManCountIntLevels( p, p->FirstVar );
    sat_solver_setnvars( p->pSat, nVarsAll );
    // other
    Gia_ManFillValue( pGia );
    return p;
}